

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

size_t __thiscall Assimp::Importer::GetImporterIndex(Importer *this,char *szExtension)

{
  undefined8 __s;
  __type _Var1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  reference ppBVar3;
  reference __rhs;
  bool bVar4;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_e0;
  __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_d8;
  _Self local_d0;
  _Self local_c8;
  const_iterator it;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_b8;
  __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_b0;
  const_iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string ext;
  char *szExtension_local;
  Importer *this_local;
  
  ext.field_2._8_8_ = szExtension;
  if (szExtension == (char *)0x0) {
    __assert_fail("nullptr != szExtension",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Importer.cpp"
                  ,0x3a5,"size_t Assimp::Importer::GetImporterIndex(const char *) const");
  }
  while( true ) {
    __s = ext.field_2._8_8_;
    bVar4 = true;
    if (*(char *)ext.field_2._8_8_ != '*') {
      bVar4 = *(char *)ext.field_2._8_8_ == '.';
    }
    if (!bVar4) break;
    ext.field_2._8_8_ = ext.field_2._8_8_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,(char *)__s,&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
              (__first,__last,__result,ToLower<char>);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&i);
    local_b8._M_current =
         (BaseImporter **)
         std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::begin
                   (&this->pimpl->mImporter);
    __gnu_cxx::
    __normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
    ::__normal_iterator<Assimp::BaseImporter**>
              ((__normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
                *)&local_b0,&local_b8);
    while( true ) {
      it._M_node = (_Base_ptr)
                   std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::end
                             (&this->pimpl->mImporter);
      bVar4 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
                          *)&it);
      if (!bVar4) break;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
      ppBVar3 = __gnu_cxx::
                __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
                ::operator*(&local_b0);
      BaseImporter::GetExtensionList
                (*ppBVar3,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i);
      local_c8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i);
      while( true ) {
        local_d0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i);
        bVar4 = std::operator!=(&local_c8,&local_d0);
        if (!bVar4) break;
        __rhs = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_c8);
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,__rhs);
        if (_Var1) {
          local_e0._M_current =
               (BaseImporter **)
               std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::begin
                         (&this->pimpl->mImporter);
          __gnu_cxx::
          __normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
          ::__normal_iterator<Assimp::BaseImporter**>
                    ((__normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
                      *)&local_d8,&local_e0);
          this_local = (Importer *)
                       std::
                       distance<__gnu_cxx::__normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>>
                                 (local_d8,local_b0);
          bVar4 = true;
          goto LAB_0052b8e8;
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_c8);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::BaseImporter_*const_*,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
      ::operator++(&local_b0);
    }
    bVar4 = false;
LAB_0052b8e8:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  }
  else {
    this_local = (Importer *)0xffffffffffffffff;
    bVar4 = true;
  }
  std::__cxx11::string::~string((string *)local_40);
  if (!bVar4) {
    this_local = (Importer *)0xffffffffffffffff;
  }
  return (size_t)this_local;
}

Assistant:

size_t Importer::GetImporterIndex (const char* szExtension) const {
    ai_assert(nullptr != szExtension);

    ASSIMP_BEGIN_EXCEPTION_REGION();

    // skip over wildcard and dot characters at string head --
    for ( ; *szExtension == '*' || *szExtension == '.'; ++szExtension );

    std::string ext(szExtension);
    if (ext.empty()) {
        return static_cast<size_t>(-1);
    }
    std::transform( ext.begin(), ext.end(), ext.begin(), ToLower<char> );

    std::set<std::string> str;
    for (std::vector<BaseImporter*>::const_iterator i =  pimpl->mImporter.begin();i != pimpl->mImporter.end();++i)  {
        str.clear();

        (*i)->GetExtensionList(str);
        for (std::set<std::string>::const_iterator it = str.begin(); it != str.end(); ++it) {
            if (ext == *it) {
                return std::distance(static_cast< std::vector<BaseImporter*>::const_iterator >(pimpl->mImporter.begin()), i);
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(size_t);
    return static_cast<size_t>(-1);
}